

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathReleaseObject(xmlXPathContextPtr ctxt,xmlXPathObjectPtr obj)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr ns;
  int iVar2;
  int *piVar3;
  xmlNodeSetPtr tmpset;
  undefined8 *puVar4;
  long lVar5;
  xmlNodeSetPtr *ppxVar6;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) ||
     (puVar4 = (undefined8 *)ctxt->cache, puVar4 == (undefined8 *)0x0)) {
    xmlXPathFreeObject(obj);
    return;
  }
  switch(obj->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar1 = obj->nodesetval;
    if (pxVar1 != (xmlNodeSetPtr)0x0) {
      if ((pxVar1->nodeMax < 0x29) &&
         (iVar2 = *(int *)(puVar4 + 2), iVar2 < *(int *)((long)puVar4 + 0x14))) {
        piVar3 = (int *)(puVar4 + 2);
        goto LAB_001bcb34;
      }
      ppxVar6 = &obj->nodesetval;
      xmlXPathFreeNodeSet(pxVar1);
      goto LAB_001bcb1b;
    }
    break;
  case XPATH_BOOLEAN:
  case XPATH_NUMBER:
    break;
  case XPATH_STRING:
    ppxVar6 = (xmlNodeSetPtr *)&obj->stringval;
    if (obj->stringval != (xmlChar *)0x0) {
      (*xmlFree)(obj->stringval);
    }
LAB_001bcb1b:
    *ppxVar6 = (xmlNodeSetPtr)0x0;
    break;
  default:
    goto switchD_001bcacc_caseD_5;
  }
  iVar2 = *(int *)(puVar4 + 3);
  if (iVar2 < *(int *)((long)puVar4 + 0x1c)) {
    piVar3 = (int *)(puVar4 + 3);
    puVar4 = puVar4 + 1;
LAB_001bcb34:
    obj->stringval = (xmlChar *)*puVar4;
    *puVar4 = obj;
    *piVar3 = iVar2 + 1;
    obj->boolval = 0;
    pxVar1 = obj->nodesetval;
    if (pxVar1 != (xmlNodeSetPtr)0x0) {
      if ((0 < pxVar1->nodeNr) && (0 < pxVar1->nodeNr)) {
        lVar5 = 0;
        do {
          ns = pxVar1->nodeTab[lVar5];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < pxVar1->nodeNr);
      }
      pxVar1->nodeNr = 0;
    }
    return;
  }
switchD_001bcacc_caseD_5:
  if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
    xmlXPathFreeNodeSet(obj->nodesetval);
  }
  (*xmlFree)(obj);
  return;
}

Assistant:

static void
xmlXPathReleaseObject(xmlXPathContextPtr ctxt, xmlXPathObjectPtr obj)
{
    if (obj == NULL)
	return;
    if ((ctxt == NULL) || (ctxt->cache == NULL)) {
	 xmlXPathFreeObject(obj);
    } else {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	switch (obj->type) {
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		if (obj->nodesetval != NULL) {
		    if ((obj->nodesetval->nodeMax <= 40) &&
			(cache->numNodeset < cache->maxNodeset)) {
                        obj->stringval = (void *) cache->nodesetObjs;
                        cache->nodesetObjs = obj;
                        cache->numNodeset += 1;
			goto obj_cached;
		    } else {
			xmlXPathFreeNodeSet(obj->nodesetval);
			obj->nodesetval = NULL;
		    }
		}
		break;
	    case XPATH_STRING:
		if (obj->stringval != NULL)
		    xmlFree(obj->stringval);
                obj->stringval = NULL;
		break;
	    case XPATH_BOOLEAN:
	    case XPATH_NUMBER:
		break;
	    default:
		goto free_obj;
	}

	/*
	* Fallback to adding to the misc-objects slot.
	*/
        if (cache->numMisc >= cache->maxMisc)
	    goto free_obj;
        obj->stringval = (void *) cache->miscObjs;
        cache->miscObjs = obj;
        cache->numMisc += 1;

obj_cached:
        obj->boolval = 0;
	if (obj->nodesetval != NULL) {
	    xmlNodeSetPtr tmpset = obj->nodesetval;

	    /*
	    * Due to those nasty ns-nodes, we need to traverse
	    * the list and free the ns-nodes.
	    */
	    if (tmpset->nodeNr > 0) {
		int i;
		xmlNodePtr node;

		for (i = 0; i < tmpset->nodeNr; i++) {
		    node = tmpset->nodeTab[i];
		    if ((node != NULL) &&
			(node->type == XML_NAMESPACE_DECL))
		    {
			xmlXPathNodeSetFreeNs((xmlNsPtr) node);
		    }
		}
	    }
	    tmpset->nodeNr = 0;
        }

	return;

free_obj:
	/*
	* Cache is full; free the object.
	*/
	if (obj->nodesetval != NULL)
	    xmlXPathFreeNodeSet(obj->nodesetval);
	xmlFree(obj);
    }
}